

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.h
# Opt level: O3

Object * flatbuffers::GetUnionType(Schema *schema,Object *parent,Field *unionfield,Table *table)

{
  uint uVar1;
  uchar uVar2;
  uint8_t *offset_location;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long *plVar6;
  uint *puVar7;
  int *piVar8;
  char *__function;
  long *plVar9;
  Field *pFVar10;
  Schema *pSVar11;
  Object *pOVar12;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  Table *local_60;
  long *local_58 [2];
  long local_48 [2];
  long *local_38;
  
  if ((*(ushort *)(schema + -(long)*(int *)schema) < 7) ||
     (uVar3 = (ulong)*(ushort *)(schema + (6 - (long)*(int *)schema)), uVar3 == 0)) {
    pSVar11 = (Schema *)0x0;
  }
  else {
    pSVar11 = schema + *(uint *)(schema + uVar3) + uVar3;
  }
  lVar4 = -(long)*(int *)unionfield;
  if ((*(ushort *)(unionfield + -(long)*(int *)unionfield) < 7) ||
     (uVar3 = (ulong)*(ushort *)(unionfield + lVar4 + 6), uVar3 == 0)) {
    pFVar10 = (Field *)0x0;
  }
  else {
    pFVar10 = unionfield + *(uint *)(unionfield + uVar3) + uVar3;
  }
  if (((*(ushort *)(pFVar10 + -(long)*(int *)pFVar10) < 9) ||
      ((ulong)*(ushort *)(pFVar10 + (8 - (long)*(int *)pFVar10)) == 0)) ||
     (*(uint *)pSVar11 <= *(uint *)(pFVar10 + *(ushort *)(pFVar10 + (8 - (long)*(int *)pFVar10)))))
  {
    __function = 
    "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Enum>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Enum>, SizeT = unsigned int]"
    ;
  }
  else {
    uVar3 = (ulong)(*(uint *)(pFVar10 + *(ushort *)(pFVar10 + (8 - (long)*(int *)pFVar10))) << 2);
    if ((*(ushort *)(parent + -(long)*(int *)parent) < 7) ||
       (uVar5 = (ulong)*(ushort *)(parent + (6 - (long)*(int *)parent)), uVar5 == 0)) {
      pOVar12 = (Object *)0x0;
    }
    else {
      pOVar12 = parent + *(uint *)(parent + uVar5) + uVar5;
    }
    uVar1 = *(uint *)(pSVar11 + uVar3 + 4);
    uVar5 = (ulong)*(ushort *)(unionfield + lVar4 + 4);
    local_58[0] = local_48;
    local_60 = table;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_58,unionfield + (ulong)*(uint *)(unionfield + uVar5) + 4 + uVar5,
               unionfield +
               (ulong)*(uint *)(unionfield + (ulong)*(uint *)(unionfield + uVar5) + 4 + uVar5 + -4)
               + *(uint *)(unionfield + uVar5) + uVar5 + 4);
    plVar6 = (long *)std::__cxx11::string::append((char *)local_58);
    plVar9 = plVar6 + 2;
    if ((long *)*plVar6 == plVar9) {
      local_70 = *plVar9;
      lStack_68 = plVar6[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar9;
      local_80 = (long *)*plVar6;
    }
    local_78 = plVar6[1];
    *plVar6 = (long)plVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    local_38 = local_80;
    puVar7 = (uint *)bsearch(&local_38,pOVar12 + 4,(ulong)*(uint *)pOVar12,4,
                             Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::
                             KeyCompare<char_const*>);
    if (puVar7 == (uint *)0x0) {
      pFVar10 = (Field *)0x0;
    }
    else {
      pFVar10 = (Field *)((ulong)*puVar7 + (long)puVar7);
    }
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    if (pFVar10 == (Field *)0x0) {
      __assert_fail("type_field",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/reflection.h"
                    ,0x1ac,
                    "const reflection::Object &flatbuffers::GetUnionType(const reflection::Schema &, const reflection::Object &, const reflection::Field &, const Table &)"
                   );
    }
    pSVar11 = pSVar11 + uVar1 + uVar3 + 4;
    uVar2 = GetFieldI<unsigned_char>(local_60,pFVar10);
    local_80 = (long *)CONCAT71(local_80._1_7_,uVar2);
    puVar7 = (uint *)bsearch(&local_80,
                             pSVar11 + (ulong)*(uint *)(pSVar11 +
                                                       *(ushort *)
                                                        (pSVar11 + (6 - (long)*(int *)pSVar11))) + 4
                                       + (ulong)*(ushort *)(pSVar11 + (6 - (long)*(int *)pSVar11)),
                             (ulong)*(uint *)(pSVar11 + (ulong)*(uint *)(pSVar11 +
                                                                        *(ushort *)
                                                                         (pSVar11 +
                                                                         (6 - (long)*(int *)pSVar11)
                                                                         )) + 4 +
                                                        (ulong)*(ushort *)
                                                                (pSVar11 +
                                                                (6 - (long)*(int *)pSVar11)) + -4),4
                             ,Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int>::
                              KeyCompare<unsigned_char>);
    if (puVar7 == (uint *)0x0) {
      piVar8 = (int *)0x0;
    }
    else {
      piVar8 = (int *)((ulong)*puVar7 + (long)puVar7);
    }
    if ((*(ushort *)(schema + -(long)*(int *)schema) < 5) ||
       (uVar3 = (ulong)*(ushort *)(schema + (4 - (long)*(int *)schema)), uVar3 == 0)) {
      pSVar11 = (Schema *)0x0;
    }
    else {
      pSVar11 = schema + *(uint *)(schema + uVar3) + uVar3;
    }
    if ((*(ushort *)((long)piVar8 - (long)*piVar8) < 0xb) ||
       (uVar3 = (ulong)*(ushort *)((long)piVar8 + (10 - (long)*piVar8)), uVar3 == 0)) {
      piVar8 = (int *)0x0;
    }
    else {
      piVar8 = (int *)((long)piVar8 + *(uint *)((long)piVar8 + uVar3) + uVar3);
    }
    if (((8 < *(ushort *)((long)piVar8 - (long)*piVar8)) &&
        (uVar3 = (ulong)*(ushort *)((long)piVar8 + (8 - (long)*piVar8)), uVar3 != 0)) &&
       (uVar1 = *(uint *)((long)piVar8 + uVar3), uVar1 < *(uint *)pSVar11)) {
      uVar3 = (ulong)(uVar1 << 2);
      return (Object *)(pSVar11 + *(uint *)(pSVar11 + uVar3 + 4) + uVar3 + 4);
    }
    __function = 
    "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Object>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Object>, SizeT = unsigned int]"
    ;
  }
  __assert_fail("i < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/vector.h"
                ,0xc1,__function);
}

Assistant:

inline const reflection::Object &GetUnionType(
    const reflection::Schema &schema, const reflection::Object &parent,
    const reflection::Field &unionfield, const Table &table) {
  auto enumdef = schema.enums()->Get(unionfield.type()->index());
  // TODO: this is clumsy and slow, but no other way to find it?
  auto type_field = parent.fields()->LookupByKey(
      (unionfield.name()->str() + UnionTypeFieldSuffix()).c_str());
  FLATBUFFERS_ASSERT(type_field);
  auto union_type = GetFieldI<uint8_t>(table, *type_field);
  auto enumval = enumdef->values()->LookupByKey(union_type);
  return *schema.objects()->Get(enumval->union_type()->index());
}